

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall re2::RE2::PossibleMatchRange(RE2 *this,string *min,string *max,int maxlen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int i;
  long lVar3;
  char cVar4;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *prefix;
  StringPiece *extraout_RDX_01;
  int iVar5;
  string dmin;
  string pmax;
  string pmin;
  string dmax;
  string local_f0;
  string *local_d0;
  string *local_c8;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string local_80;
  string local_60;
  undefined1 *local_40;
  undefined4 local_38;
  
  if (this->prog_ == (Prog *)0x0) {
    return false;
  }
  iVar5 = (int)(this->prefix_)._M_string_length;
  if (maxlen <= iVar5) {
    iVar5 = maxlen;
  }
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_c0 = local_b0;
  local_b8 = 0;
  local_b0[0] = 0;
  local_d0 = max;
  local_c8 = min;
  std::__cxx11::string::substr((ulong)&local_f0,(ulong)&this->prefix_);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_f0,(ulong)&this->prefix_);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_f0);
  prefix = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
    prefix = extraout_RDX_00;
  }
  if ((0 < iVar5) && (this->prefix_foldcase_ != false)) {
    lVar3 = 0;
    do {
      cVar4 = local_a0[lVar3];
      if ((byte)(cVar4 + 0x9fU) < 0x1a) {
        cVar4 = cVar4 + -0x20;
        local_a0[lVar3] = cVar4;
      }
      prefix = (StringPiece *)CONCAT71((int7)((ulong)prefix >> 8),cVar4);
      lVar3 = lVar3 + 1;
    } while (iVar5 != lVar3);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)paVar1;
  if ((maxlen - iVar5 == 0 || maxlen < iVar5) ||
     (bVar2 = Prog::PossibleMatchRange(this->prog_,&local_f0,&local_80,maxlen - iVar5),
     prefix = extraout_RDX_01, !bVar2)) {
    if (local_b8 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)local_c8,0,(char *)local_c8->_M_string_length,0x13426e);
      bVar2 = false;
      std::__cxx11::string::_M_replace
                ((ulong)local_d0,0,(char *)local_d0->_M_string_length,0x13426e);
      goto LAB_0012715a;
    }
    local_40 = local_c0;
    local_38 = (undefined4)local_b8;
    PrefixSuccessor_abi_cxx11_(&local_60,(re2 *)&local_40,prefix);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_f0._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_80._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign((string *)local_c8);
  bVar2 = true;
  std::__cxx11::string::_M_assign((string *)local_d0);
LAB_0012715a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return bVar2;
}

Assistant:

bool RE2::PossibleMatchRange(string* min, string* max, int maxlen) const {
  if (prog_ == NULL)
    return false;

  int n = static_cast<int>(prefix_.size());
  if (n > maxlen)
    n = maxlen;

  // Determine initial min max from prefix_ literal.
  string pmin, pmax;
  pmin = prefix_.substr(0, n);
  pmax = prefix_.substr(0, n);
  if (prefix_foldcase_) {
    // prefix is ASCII lowercase; change pmin to uppercase.
    for (int i = 0; i < n; i++) {
      if ('a' <= pmin[i] && pmin[i] <= 'z')
        pmin[i] += 'A' - 'a';
    }
  }

  // Add to prefix min max using PossibleMatchRange on regexp.
  string dmin, dmax;
  maxlen -= n;
  if (maxlen > 0 && prog_->PossibleMatchRange(&dmin, &dmax, maxlen)) {
    pmin += dmin;
    pmax += dmax;
  } else if (pmax.size() > 0) {
    // prog_->PossibleMatchRange has failed us,
    // but we still have useful information from prefix_.
    // Round up pmax to allow any possible suffix.
    pmax = PrefixSuccessor(pmax);
  } else {
    // Nothing useful.
    *min = "";
    *max = "";
    return false;
  }

  *min = pmin;
  *max = pmax;
  return true;
}